

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::clear_memo_foreach_action(search_private *priv)

{
  size_t sVar1;
  v_array<Search::action_cache> **ppvVar2;
  long in_RDI;
  size_t i;
  v_array<Search::action_cache> *in_stack_ffffffffffffffe0;
  ulong local_10;
  
  for (local_10 = 0;
      sVar1 = v_array<v_array<Search::action_cache>_*>::size
                        ((v_array<v_array<Search::action_cache>_*> *)(in_RDI + 0x668)),
      local_10 < sVar1; local_10 = local_10 + 1) {
    ppvVar2 = v_array<v_array<Search::action_cache>_*>::operator[]
                        ((v_array<v_array<Search::action_cache>_*> *)(in_RDI + 0x668),local_10);
    if (*ppvVar2 != (v_array<Search::action_cache> *)0x0) {
      v_array<v_array<Search::action_cache>_*>::operator[]
                ((v_array<v_array<Search::action_cache>_*> *)(in_RDI + 0x668),local_10);
      v_array<Search::action_cache>::delete_v(in_stack_ffffffffffffffe0);
      ppvVar2 = v_array<v_array<Search::action_cache>_*>::operator[]
                          ((v_array<v_array<Search::action_cache>_*> *)(in_RDI + 0x668),local_10);
      in_stack_ffffffffffffffe0 = *ppvVar2;
      if (in_stack_ffffffffffffffe0 != (v_array<Search::action_cache> *)0x0) {
        operator_delete(in_stack_ffffffffffffffe0);
      }
    }
  }
  v_array<v_array<Search::action_cache>_*>::clear
            ((v_array<v_array<Search::action_cache>_*> *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void clear_memo_foreach_action(search_private& priv)
{
  for (size_t i = 0; i < priv.memo_foreach_action.size(); i++)
    if (priv.memo_foreach_action[i])
    {
      priv.memo_foreach_action[i]->delete_v();
      delete priv.memo_foreach_action[i];
    }
  priv.memo_foreach_action.clear();
}